

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

BinaryExpr<const_c74::min::message_type_&,_const_c74::min::message_type_&> * __thiscall
Catch::ExprLhs<c74::min::message_type_const&>::operator==
          (BinaryExpr<const_c74::min::message_type_&,_const_c74::min::message_type_&>
           *__return_storage_ptr__,ExprLhs<c74::min::message_type_const&> *this,message_type *rhs)

{
  message_type *lhs;
  bool comparisonResult;
  StringRef local_30;
  message_type *local_20;
  message_type *rhs_local;
  ExprLhs<const_c74::min::message_type_&> *this_local;
  
  local_20 = rhs;
  rhs_local = (message_type *)this;
  this_local = (ExprLhs<const_c74::min::message_type_&> *)__return_storage_ptr__;
  comparisonResult =
       compareEqual<c74::min::message_type,c74::min::message_type>(*(message_type **)this,rhs);
  lhs = *(message_type **)this;
  StringRef::StringRef(&local_30,"==");
  BinaryExpr<const_c74::min::message_type_&,_const_c74::min::message_type_&>::BinaryExpr
            (__return_storage_ptr__,comparisonResult,lhs,local_30,local_20);
  return __return_storage_ptr__;
}

Assistant:

auto operator == ( RhsT const& rhs ) -> BinaryExpr<LhsT, RhsT const&> const {
            return { compareEqual( m_lhs, rhs ), m_lhs, "==", rhs };
        }